

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O0

void concept_const_suite::forward_iterator_default_constructible(void)

{
  initializer_list<int> __l;
  bool bVar1;
  iterator begin;
  iterator end;
  size_type length;
  const_iterator cVar2;
  view_pointer local_c8;
  view_pointer pcStack_c0;
  undefined1 auStack_b8 [8];
  const_iterator b;
  undefined1 local_a0 [8];
  const_iterator a;
  circular_view<int,18446744073709551615ul> local_78 [8];
  circular_view<int,_18446744073709551615UL> span;
  allocator<int> local_41;
  int local_40 [4];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> data;
  
  local_40[0] = 0xb;
  local_40[1] = 0x16;
  local_40[2] = 0x21;
  local_40[3] = 0x2c;
  local_30 = local_40;
  local_28 = 4;
  std::allocator<int>::allocator(&local_41);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l,&local_41);
  std::allocator<int>::~allocator(&local_41);
  begin = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_20);
  end = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_20);
  a.current = (size_type)
              std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_20);
  length = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)local_20);
  vista::circular_view<int,18446744073709551615ul>::
  circular_view<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (local_78,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)end._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)a.current,length);
  _local_a0 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_78);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_78);
  local_c8 = cVar2.parent;
  pcStack_c0 = (view_pointer)cVar2.current;
  auStack_b8 = (undefined1  [8])local_c8;
  b.parent = pcStack_c0;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    ((basic_iterator<const_int> *)local_a0,(iterator_type *)auStack_b8);
  boost::detail::test_impl
            ("a == b",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x1ab,"void concept_const_suite::forward_iterator_default_constructible()",bVar1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    ((basic_iterator<const_int> *)auStack_b8,(iterator_type *)local_a0);
  boost::detail::test_impl
            ("b == a",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x1ac,"void concept_const_suite::forward_iterator_default_constructible()",bVar1);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_20);
  return;
}

Assistant:

void forward_iterator_default_constructible()
{
    // Only valid operations on default constructed iterator are assignment and
    // destruction (see [iterator.requirements.general] / 7)

    static_assert(std::is_default_constructible<circular_view<int>::const_iterator>::value, "default constructible");

    std::vector<int> data = { 11, 22, 33, 44 };
    const circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::const_iterator a = span.begin();
    circular_view<int>::const_iterator b; // Singular value not associated with span
    b = span.begin();
    BOOST_TEST(a == b);
    BOOST_TEST(b == a);
}